

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

int __thiscall QMessageBoxPrivate::dialogCode(QMessageBoxPrivate *this)

{
  ButtonRole BVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = (this->super_QDialogPrivate).rescode;
  if (1 < iVar2) {
    piVar3 = &(this->super_QDialogPrivate).rescode;
    if (this->clickedButton != (QAbstractButton *)0x0) {
      BVar1 = QDialogButtonBox::buttonRole
                        (*(QDialogButtonBox **)
                          (*(long *)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.
                                               field_0x8 + 8) + 0x2f8),this->clickedButton);
      if (((uint)BVar1 < 7) && ((99U >> (BVar1 & 0x1f) & 1) != 0)) {
        piVar3 = (int *)(&DAT_006f66e8 + (ulong)(uint)BVar1 * 4);
      }
    }
    iVar2 = *piVar3;
  }
  return iVar2;
}

Assistant:

int QMessageBoxPrivate::dialogCode() const
{
    Q_Q(const QMessageBox);

    if (rescode <= QDialog::Accepted) {
        return rescode;
    } else if (clickedButton) {
        switch (q->buttonRole(clickedButton)) {
        case QMessageBox::AcceptRole:
        case QMessageBox::YesRole:
            return QDialog::Accepted;
        case QMessageBox::RejectRole:
        case QMessageBox::NoRole:
            return QDialog::Rejected;
        default:
            ;
        }
    }

    return QDialogPrivate::dialogCode();
}